

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::iftest::test(iftest *this)

{
  allocator<char> local_8d1;
  string local_8d0;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  string local_868;
  allocator<char> local_841;
  string local_840;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  string local_790;
  allocator<char> local_769;
  string local_768;
  string local_748;
  allocator<char> local_721;
  string local_720;
  string local_700;
  allocator<char> local_6d9;
  string local_6d8;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  string local_628;
  allocator<char> local_601;
  string local_600;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  string local_598;
  allocator<char> local_571;
  string local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  string local_478;
  allocator<char> local_451;
  string local_450;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  iftest *local_10;
  iftest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"(if (< 2 3) (2) (3))",&local_51);
  compile_fixture::run(&local_30,&this->super_compile_fixture,&local_50,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5b9,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"(if (< 3 2) (2) (3))",&local_a9);
  compile_fixture::run(&local_88,&this->super_compile_fixture,&local_a8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5ba,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"(if #t 12 13)",&local_f1);
  compile_fixture::run(&local_d0,&this->super_compile_fixture,&local_f0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("12",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5bb,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"(if #f 12 13)",&local_139);
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_138,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5bc,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"(if 0 12 13)",&local_181)
  ;
  compile_fixture::run(&local_160,&this->super_compile_fixture,&local_180,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("12",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5bd,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(if () 43 ())",&local_1c9);
  compile_fixture::run(&local_1a8,&this->super_compile_fixture,&local_1c8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("43",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5be,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"(if #t (if 12 13 4) 17)",&local_211);
  compile_fixture::run(&local_1f0,&this->super_compile_fixture,&local_210,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5bf,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"(if #f 12 (if #f 13 4))",&local_259);
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_258,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("4",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c0,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"(if #\\X (if 1 2 3) (if 4 5 6))",&local_2a1);
  compile_fixture::run(&local_280,&this->super_compile_fixture,&local_2a0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c1,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"(if (not (boolean? #t)) 15 (boolean? #f))",&local_2e9);
  compile_fixture::run(&local_2c8,&this->super_compile_fixture,&local_2e8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c2,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"(if (if (char? #\\a) (boolean? #\\b) (fixnum? #\\c)) 119 -23)",
             &local_331);
  compile_fixture::run(&local_310,&this->super_compile_fixture,&local_330,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("-23",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c3,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"(if (if (if (not 1) (not 2) (not 3)) 4 5) 6 7)",&local_379);
  compile_fixture::run(&local_358,&this->super_compile_fixture,&local_378,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("6",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c4,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"(if (not (if (if (not 1) (not 2) (not 3)) 4 5)) 6 7)",&local_3c1)
  ;
  compile_fixture::run(&local_3a0,&this->super_compile_fixture,&local_3c0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c5,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"(not (if (not (if (if (not 1) (not 2) (not 3)) 4 5)) 6 7)) ",
             &local_409);
  compile_fixture::run(&local_3e8,&this->super_compile_fixture,&local_408,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c6,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"(if (char? 12) 13 14) ",&local_451);
  compile_fixture::run(&local_430,&this->super_compile_fixture,&local_450,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("14",&local_430,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c7,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"(if (char? #\\a) 13 14) ",&local_499);
  compile_fixture::run(&local_478,&this->super_compile_fixture,&local_498,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c8,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"(add1 (if (sub1 1) (sub1 13) 14))",&local_4e1);
  compile_fixture::run(&local_4c0,&this->super_compile_fixture,&local_4e0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_4c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5c9,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"(if (= 12 13) 12 13) ",&local_529);
  compile_fixture::run(&local_508,&this->super_compile_fixture,&local_528,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_508,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5cb,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"(if (= 12 12) 13 14) ",&local_571);
  compile_fixture::run(&local_550,&this->super_compile_fixture,&local_570,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_550,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5cc,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"(if (< 12 13) 12 13) ",&local_5b9);
  compile_fixture::run(&local_598,&this->super_compile_fixture,&local_5b8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("12",&local_598,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5cd,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"(if (< 12 12) 13 14) ",&local_601);
  compile_fixture::run(&local_5e0,&this->super_compile_fixture,&local_600,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("14",&local_5e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5ce,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"(if (< 13 12) 13 14) ",&local_649);
  compile_fixture::run(&local_628,&this->super_compile_fixture,&local_648,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("14",&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5cf,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"(if (<= 12 13) 12 13) ",&local_691);
  compile_fixture::run(&local_670,&this->super_compile_fixture,&local_690,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("12",&local_670,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5d0,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"(if (<= 12 12) 12 13) ",&local_6d9);
  compile_fixture::run(&local_6b8,&this->super_compile_fixture,&local_6d8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("12",&local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5d1,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator(&local_6d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,"(if (<= 13 12) 13 14) ",&local_721);
  compile_fixture::run(&local_700,&this->super_compile_fixture,&local_720,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("14",&local_700,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5d2,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"(if (> 12 13) 12 13) ",&local_769);
  compile_fixture::run(&local_748,&this->super_compile_fixture,&local_768,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_748,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5d3,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"(if (> 12 12) 12 13) ",&local_7b1);
  compile_fixture::run(&local_790,&this->super_compile_fixture,&local_7b0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_790,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5d4,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"(if (> 13 12) 13 14) ",&local_7f9);
  compile_fixture::run(&local_7d8,&this->super_compile_fixture,&local_7f8,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_7d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5d5,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_840,"(if (>= 12 13) 12 13) ",&local_841);
  compile_fixture::run(&local_820,&this->super_compile_fixture,&local_840,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_820,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5d6,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_840);
  std::allocator<char>::~allocator(&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"(if (>= 12 12) 12 13) ",&local_889);
  compile_fixture::run(&local_868,&this->super_compile_fixture,&local_888,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("12",&local_868,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5d7,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d0,"(if (>= 13 12) 13 14) ",&local_8d1);
  compile_fixture::run(&local_8b0,&this->super_compile_fixture,&local_8d0,true,6);
  TestEq<char_const*,std::__cxx11::string>
            ("13",&local_8b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x5d8,"void skiwi::(anonymous namespace)::iftest::test()");
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  return;
}

Assistant:

void test()
      {
      TEST_EQ("2", run("(if (< 2 3) (2) (3))"));
      TEST_EQ("3", run("(if (< 3 2) (2) (3))"));
      TEST_EQ("12", run("(if #t 12 13)"));
      TEST_EQ("13", run("(if #f 12 13)"));
      TEST_EQ("12", run("(if 0 12 13)"));
      TEST_EQ("43", run("(if () 43 ())"));
      TEST_EQ("13", run("(if #t (if 12 13 4) 17)"));
      TEST_EQ("4", run("(if #f 12 (if #f 13 4))"));
      TEST_EQ("2", run(R"((if #\X (if 1 2 3) (if 4 5 6)))"));
      TEST_EQ("#t", run("(if (not (boolean? #t)) 15 (boolean? #f))"));
      TEST_EQ("-23", run(R"((if (if (char? #\a) (boolean? #\b) (fixnum? #\c)) 119 -23))"));
      TEST_EQ("6", run(R"((if (if (if (not 1) (not 2) (not 3)) 4 5) 6 7))"));
      TEST_EQ("7", run(R"((if (not (if (if (not 1) (not 2) (not 3)) 4 5)) 6 7))"));
      TEST_EQ("#f", run(R"((not (if (not (if (if (not 1) (not 2) (not 3)) 4 5)) 6 7)) )"));
      TEST_EQ("14", run(R"((if (char? 12) 13 14) )"));
      TEST_EQ("13", run(R"((if (char? #\a) 13 14) )"));
      TEST_EQ("13", run(R"((add1 (if (sub1 1) (sub1 13) 14)))"));

      TEST_EQ("13", run("(if (= 12 13) 12 13) "));
      TEST_EQ("13", run("(if (= 12 12) 13 14) "));
      TEST_EQ("12", run("(if (< 12 13) 12 13) "));
      TEST_EQ("14", run("(if (< 12 12) 13 14) "));
      TEST_EQ("14", run("(if (< 13 12) 13 14) "));
      TEST_EQ("12", run("(if (<= 12 13) 12 13) "));
      TEST_EQ("12", run("(if (<= 12 12) 12 13) "));
      TEST_EQ("14", run("(if (<= 13 12) 13 14) "));
      TEST_EQ("13", run("(if (> 12 13) 12 13) "));
      TEST_EQ("13", run("(if (> 12 12) 12 13) "));
      TEST_EQ("13", run("(if (> 13 12) 13 14) "));
      TEST_EQ("13", run("(if (>= 12 13) 12 13) "));
      TEST_EQ("12", run("(if (>= 12 12) 12 13) "));
      TEST_EQ("13", run("(if (>= 13 12) 13 14) "));
      }